

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::Integrator
          (FormattingScene *this,string *name,ParsedParameterVector params,FileLoc loc)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  int *in_RCX;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_RDX;
  string *this_00;
  string lss;
  allocator<char> local_161;
  string local_160;
  string local_140;
  vector<int,_std::allocator<int>_> iterations;
  string extra;
  ParameterDictionary dict;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  local_80;
  
  this_00 = &lss;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(&local_80,in_RDX);
  ParameterDictionary::ParameterDictionary(&dict,&local_80,RGBColorSpace::sRGB);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&local_80);
  extra._M_dataplus._M_p = (pointer)&extra.field_2;
  extra._M_string_length = 0;
  extra.field_2._M_local_buf[0] = '\0';
  bVar2 = this->upgrade;
  if ((bool)bVar2 == true) {
    bVar1 = std::operator==(name,"sppm");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lss,"imagewritefrequency",(allocator<char> *)&local_160);
      ParameterDictionary::RemoveInt(&dict,&lss);
      std::__cxx11::string::~string((string *)&lss);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&lss,"numiterations",(allocator<char> *)&local_160);
      ParameterDictionary::GetIntArray(&iterations,&dict,&lss);
      std::__cxx11::string::~string((string *)&lss);
      if (iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&lss,"numiterations",(allocator<char> *)&local_160);
        ParameterDictionary::RemoveInt(&dict,&lss);
        std::__cxx11::string::~string((string *)&lss);
        indent_abi_cxx11_(&local_160,this,1);
        StringPrintf<int&>(&local_140,(pbrt *)"\"integer iterations\" [ %d ]\n",
                           (char *)iterations.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start,in_RCX);
        std::operator+(&lss,&local_160,&local_140);
        std::__cxx11::string::append((string *)&extra);
        std::__cxx11::string::~string((string *)&lss);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_160);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&iterations.super__Vector_base<int,_std::allocator<int>_>);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_160,"lightsamplestrategy",(allocator<char> *)&iterations);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"",&local_161);
    ParameterDictionary::GetOneString(&lss,&dict,&local_160,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    bVar1 = std::operator==(&lss,"spatial");
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_160,"lightsamplestrategy",(allocator<char> *)&local_140);
      ParameterDictionary::RemoveString(&dict,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      indent_abi_cxx11_(&local_140,this,1);
      std::operator+(&local_160,&local_140,"\"string lightsamplestrategy\" \"bvh\"\n");
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_140);
    }
    std::__cxx11::string::~string((string *)&lss);
    bVar2 = this->upgrade;
  }
  if ((bVar2 & 1) != 0) {
    bVar1 = std::operator==(name,"directlighting");
    if (bVar1) {
      indent_abi_cxx11_(&lss,this,0);
      Printf<std::__cxx11::string>("%sIntegrator \"path\"\n",&lss);
      std::__cxx11::string::~string((string *)&lss);
      indent_abi_cxx11_(&local_160,this,1);
      std::operator+(&lss,&local_160,"\"integer maxdepth\" [ 1 ]\n");
      std::__cxx11::string::append((string *)&extra);
      std::__cxx11::string::~string((string *)&lss);
      this_00 = &local_160;
      goto LAB_004fafb6;
    }
  }
  indent_abi_cxx11_(&lss,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>("%sIntegrator \"%s\"\n",&lss,name);
LAB_004fafb6:
  std::__cxx11::string::~string((string *)this_00);
  poVar3 = std::operator<<((ostream *)&std::cout,(string *)&extra);
  ParameterDictionary::ToParameterList_abi_cxx11_
            (&lss,&dict,*(int *)&(this->super_SceneRepresentation).field_0xc);
  std::operator<<(poVar3,(string *)&lss);
  std::__cxx11::string::~string((string *)&lss);
  std::__cxx11::string::~string((string *)&extra);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&dict.params);
  return;
}

Assistant:

void FormattingScene::Integrator(const std::string &name, ParsedParameterVector params,
                                 FileLoc loc) {
    ParameterDictionary dict(std::move(params), RGBColorSpace::sRGB);

    std::string extra;
    if (upgrade) {
        if (name == "sppm") {
            dict.RemoveInt("imagewritefrequency");

            std::vector<int> iterations = dict.GetIntArray("numiterations");
            if (!iterations.empty()) {
                dict.RemoveInt("numiterations");
                extra += indent(1) +
                         StringPrintf("\"integer iterations\" [ %d ]\n", iterations[0]);
            }
        }
        std::string lss = dict.GetOneString("lightsamplestrategy", "");
        if (lss == "spatial") {
            dict.RemoveString("lightsamplestrategy");
            extra += indent(1) + "\"string lightsamplestrategy\" \"bvh\"\n";
        }
    }

    if (upgrade && name == "directlighting") {
        Printf("%sIntegrator \"path\"\n", indent());
        extra += indent(1) + "\"integer maxdepth\" [ 1 ]\n";
    } else
        Printf("%sIntegrator \"%s\"\n", indent(), name);
    std::cout << extra << dict.ToParameterList(catIndentCount);
}